

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::updatePixmap(QWizardPrivate *this,WizardPixmap which)

{
  long lVar1;
  long lVar2;
  QVBoxLayout *pQVar3;
  QWizardHeader *this_00;
  QLabel *pQVar4;
  bool bVar5;
  undefined4 uVar6;
  uint uVar7;
  QWidget *pQVar8;
  QLayout *pQVar9;
  long *plVar10;
  QSpacerItem *this_01;
  WizardPixmap which_00;
  Policy vPolicy;
  long in_FS_OFFSET;
  QPixmap aQStack_e8 [24];
  undefined1 auStack_d0 [16];
  undefined1 *puStack_c0;
  QString QStack_b8;
  QString QStack_98;
  undefined1 *puStack_78;
  undefined1 *puStack_70;
  undefined1 *puStack_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 *puStack_50;
  undefined8 uStack_48;
  long lStack_38;
  
  if (which == BackgroundPixmap) {
    if (this->wizStyle == MacStyle) {
      pQVar8 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
      QWidget::update(pQVar8);
      QWidget::updateGeometry(pQVar8);
      return;
    }
    return;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  uStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  layoutInfoForCurrentPage((QWizardLayoutInfo *)&puStack_78,this);
  bVar5 = QWizardLayoutInfo::operator==(&this->layoutInfo,(QWizardLayoutInfo *)&puStack_78);
  if (!bVar5) {
    recreateLayout(this,(QWizardLayoutInfo *)&puStack_78);
  }
  lVar2 = *(long *)(lVar1 + 8);
  QStack_b8.d.d = (Data *)CONCAT44(QStack_b8.d.d._4_4_,*(undefined4 *)(lVar2 + 0x340));
  QStack_98.d.d = (Data *)0x0;
  pQVar8 = &QMap<int,_QWizardPage_*>::value
                      ((QMap<int,_QWizardPage_*> *)(lVar2 + 0x2e0),(int *)&QStack_b8,
                       (QWizardPage **)&QStack_98)->super_QWidget;
  if (pQVar8 != (QWidget *)0x0) {
    pQVar9 = QWidget::layout(pQVar8);
    bVar5 = pQVar9 == (QLayout *)0x0;
    if (!bVar5) {
      pQVar3 = this->pageVBoxLayout;
      uVar6 = (**(code **)(*(long *)&(pQVar3->super_QBoxLayout).super_QLayout + 0xb8))
                        (pQVar3,pQVar8);
      plVar10 = (long *)(**(code **)(*(long *)&(pQVar3->super_QBoxLayout).super_QLayout + 0xa8))
                                  (pQVar3,uVar6);
      uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10);
      bVar5 = SUB41((uVar7 & 2) >> 1,0);
    }
    pQVar3 = this->pageVBoxLayout;
    (**(code **)(*(long *)&(pQVar3->super_QBoxLayout).super_QLayout + 200))(pQVar3);
    plVar10 = (long *)(**(code **)(*(long *)&(pQVar3->super_QBoxLayout).super_QLayout + 0xa8))
                                (pQVar3);
    this_01 = (QSpacerItem *)(**(code **)(*plVar10 + 0x78))(plVar10);
    vPolicy = MinimumExpanding;
    if (bVar5 != false) {
      vPolicy = Ignored;
    }
    QSpacerItem::changeSize(this_01,0,0,Ignored,vPolicy);
    (**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout + 0x70))();
  }
  which_00 = (WizardPixmap)pQVar8;
  if (uStack_48._0_1_ == true) {
    this_00 = this->headerWidget;
    lVar2 = *(long *)&pQVar8->field_0x8;
    QStack_98.d.d = *(Data **)(lVar2 + 0x260);
    QStack_98.d.ptr = *(char16_t **)(lVar2 + 0x268);
    QStack_98.d.size = *(undefined8 *)(lVar2 + 0x270);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar2 = *(long *)&pQVar8->field_0x8;
    QStack_b8.d.d = *(Data **)(lVar2 + 0x278);
    QStack_b8.d.ptr = *(char16_t **)(lVar2 + 0x280);
    QStack_b8.d.size = *(undefined8 *)(lVar2 + 0x288);
    if (&(QStack_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QWizardPage::pixmap((QWizardPage *)auStack_d0,which_00);
    QWizardPage::pixmap((QWizardPage *)aQStack_e8,which_00);
    QWizardHeader::setup
              (this_00,(QWizardLayoutInfo *)&puStack_78,&QStack_98,&QStack_b8,(QPixmap *)auStack_d0,
               aQStack_e8,this->titleFmt,this->subTitleFmt);
    QPixmap::~QPixmap(aQStack_e8);
    QPixmap::~QPixmap((QPixmap *)auStack_d0);
    if (&(QStack_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar5 = uStack_48._1_1_;
  if ((uStack_48._1_1_ != false) || (uStack_48._5_1_ == true)) {
    QStack_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&QStack_b8);
    if (bVar5 != false) {
      if (pQVar8 == (QWidget *)0x0) {
        QPixmap::QPixmap((QPixmap *)auStack_d0,(QPixmap *)(*(long *)(lVar1 + 8) + 0x3c0));
      }
      else {
        QWizardPage::pixmap((QWizardPage *)auStack_d0,which_00);
      }
      QStack_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QStack_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)&QStack_98);
      QStack_98.d.size = QStack_b8.d.size;
      QStack_b8.d.size = (qsizetype)puStack_c0;
      QStack_98.d.d = (Data *)QDataStream::operator<<;
      puStack_c0 = (undefined1 *)0x0;
      QPixmap::~QPixmap((QPixmap *)&QStack_98);
      QPixmap::~QPixmap((QPixmap *)auStack_d0);
    }
    QLabel::setPixmap(&this->watermarkLabel->super_QLabel,(QPixmap *)&QStack_b8);
    QPixmap::~QPixmap((QPixmap *)&QStack_b8);
  }
  if (uStack_48._2_1_ == true) {
    QLabel::setTextFormat(this->titleLabel,this->titleFmt);
    pQVar4 = this->titleLabel;
    lVar1 = *(long *)&pQVar8->field_0x8;
    QStack_98.d.d = *(Data **)(lVar1 + 0x260);
    QStack_98.d.ptr = *(char16_t **)(lVar1 + 0x268);
    QStack_98.d.size = *(undefined8 *)(lVar1 + 0x270);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLabel::setText(pQVar4,&QStack_98);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (uStack_48._3_1_ == true) {
    QLabel::setTextFormat(this->subTitleLabel,this->subTitleFmt);
    pQVar4 = this->subTitleLabel;
    lVar1 = *(long *)&pQVar8->field_0x8;
    QStack_98.d.d = *(Data **)(lVar1 + 0x278);
    QStack_98.d.ptr = *(char16_t **)(lVar1 + 0x280);
    QStack_98.d.size = *(undefined8 *)(lVar1 + 0x288);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLabel::setText(pQVar4,&QStack_98);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  enableUpdates(this);
  updateMinMaxSizes(this,(QWizardLayoutInfo *)&puStack_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updatePixmap(QWizard::WizardPixmap which)
{
    Q_Q(QWizard);
    if (which == QWizard::BackgroundPixmap) {
        if (wizStyle == QWizard::MacStyle) {
            q->update();
            q->updateGeometry();
        }
    } else {
        updateLayout();
    }
}